

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_6x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  
  lVar19 = 0;
  memset(data,0,0x100);
  uVar7 = (ulong)start_col;
  do {
    lVar8 = *(long *)((long)sample_data + lVar19);
    bVar2 = *(byte *)(lVar8 + 5 + uVar7);
    iVar16 = (uint)*(byte *)(lVar8 + uVar7) + (uint)bVar2;
    bVar3 = *(byte *)(lVar8 + 1 + uVar7);
    bVar4 = *(byte *)(lVar8 + 4 + uVar7);
    iVar14 = (uint)bVar4 + (uint)bVar3;
    bVar5 = *(byte *)(lVar8 + 2 + uVar7);
    bVar6 = *(byte *)(lVar8 + 3 + uVar7);
    iVar18 = (uint)bVar5 + (uint)bVar6;
    uVar1 = iVar16 + iVar18;
    lVar8 = (ulong)*(byte *)(lVar8 + uVar7) - (ulong)bVar2;
    iVar9 = (uint)bVar3 - (uint)bVar4;
    lVar11 = (ulong)bVar5 - (ulong)bVar6;
    data[lVar19] = (uVar1 + iVar14) * 4 + -0xc00;
    data[lVar19 + 2] = (iVar16 - iVar18) * 0x2731 + 0x400 >> 0xb;
    data[lVar19 + 4] = (DCTELEM)(((ulong)uVar1 - (ulong)(uint)(iVar14 * 2)) * 0x16a1 + 0x400 >> 0xb)
    ;
    iVar14 = (int)lVar8;
    iVar16 = (int)((lVar11 + lVar8) * 0xbb6 + 0x400U >> 0xb);
    data[lVar19 + 1] = iVar16 + (iVar9 + iVar14) * 4;
    iVar18 = (int)lVar11;
    data[lVar19 + 3] = ((iVar14 - iVar9) - iVar18) * 4;
    data[lVar19 + 5] = iVar16 + (iVar18 - iVar9) * 4;
    lVar19 = lVar19 + 8;
  } while (lVar19 != 0x30);
  lVar19 = 0;
  do {
    lVar17 = (long)(data[lVar19 + 0x28] + data[lVar19]);
    lVar15 = (long)(data[lVar19 + 0x20] + data[lVar19 + 8]);
    lVar12 = (long)(data[lVar19 + 0x18] + data[lVar19 + 0x10]);
    lVar8 = lVar12 + lVar17;
    lVar13 = (long)(data[lVar19] - data[lVar19 + 0x28]);
    lVar11 = (long)(data[lVar19 + 8] - data[lVar19 + 0x20]);
    lVar10 = (long)(data[lVar19 + 0x10] - data[lVar19 + 0x18]);
    data[lVar19] = (DCTELEM)((lVar8 + lVar15) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar19 + 0x10] = (DCTELEM)((lVar17 - lVar12) * 0x45ad + 0x4000U >> 0xf);
    data[lVar19 + 0x20] = (DCTELEM)((lVar8 + lVar15 * -2) * 0x283a + 0x4000U >> 0xf);
    lVar8 = (lVar10 + lVar13) * 0x14d3;
    data[lVar19 + 8] = (DCTELEM)((lVar11 + lVar13) * 0x38e4 + lVar8 + 0x4000U >> 0xf);
    data[lVar19 + 0x18] = (DCTELEM)(((lVar13 - lVar11) - lVar10) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar19 + 0x28] = (DCTELEM)((lVar10 - lVar11) * 0x38e4 + lVar8 + 0x4000U >> 0xf);
    lVar19 = lVar19 + 1;
  } while ((int)lVar19 != 6);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_6x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  INT32 tmp10, tmp11, tmp12;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/12). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[5]);
    tmp11 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[3]);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[5]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[3]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 - 6 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(1.224744871)),                 /* c2 */
	      CONST_BITS-PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(0.707106781)), /* c4 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = DESCALE(MULTIPLY(tmp0 + tmp2, FIX(0.366025404)),     /* c5 */
		    CONST_BITS-PASS1_BITS);

    dataptr[1] = (DCTELEM) (tmp10 + ((tmp0 + tmp1) << PASS1_BITS));
    dataptr[3] = (DCTELEM) ((tmp0 - tmp1 - tmp2) << PASS1_BITS);
    dataptr[5] = (DCTELEM) (tmp10 + ((tmp2 - tmp1) << PASS1_BITS));

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/6)**2 = 16/9, which we fold
   * into the constant multipliers:
   * cK now represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}